

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_tree.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  ostream *poVar1;
  void *pvVar2;
  PhyloTree *pPVar3;
  double dVar4;
  PhyloTree *pPVar5;
  PhyloTree *t1_00;
  PhyloTree t2;
  PhyloTree t1;
  string n2;
  string n1;
  PhyloTree t1_u_as_r;
  PhyloTree t1_r_as_u;
  PhyloTree t2_unrooted_pruned;
  PhyloTree t1_unrooted_pruned;
  pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_> p_unrooted;
  PhyloTree t2_rooted_pruned;
  PhyloTree t1_rooted_pruned;
  pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_> p_rooted;
  PhyloTree t2_unrooted;
  PhyloTree t2_rooted;
  PhyloTree t1_unrooted;
  PhyloTree t1_rooted;
  string t2_unrooted_newick;
  string t1_unrooted_newick;
  string t2_rooted_newick;
  string t1_rooted_newick;
  undefined8 in_stack_fffffffffffff500;
  undefined1 uVar6;
  PhyloTree *in_stack_fffffffffffff508;
  PhyloTree *in_stack_fffffffffffff510;
  undefined8 in_stack_fffffffffffff548;
  undefined1 uVar7;
  PhyloTree *in_stack_fffffffffffff550;
  PhyloTree *in_stack_fffffffffffff558;
  PhyloTree *in_stack_fffffffffffff680;
  PhyloTree *in_stack_fffffffffffff688;
  string local_910 [32];
  string local_8f0 [32];
  string local_8d0 [8];
  PhyloTree *in_stack_fffffffffffff738;
  string local_848 [143];
  allocator local_7b9;
  string local_7b8 [39];
  allocator local_791;
  string local_790 [32];
  string local_770 [32];
  string local_750 [32];
  string local_730 [32];
  string local_710 [32];
  string local_6f0 [136];
  string local_668 [127];
  undefined1 in_stack_fffffffffffffa17;
  string *in_stack_fffffffffffffa18;
  PhyloTree *in_stack_fffffffffffffa20;
  string local_5c0 [32];
  string local_5a0 [32];
  string local_580 [32];
  string local_560 [32];
  string local_540 [32];
  string local_520 [32];
  string local_500 [432];
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffcb0;
  PhyloTree *in_stack_fffffffffffffcb8;
  PhyloTree *in_stack_fffffffffffffcc0;
  string local_2e0 [136];
  string local_258 [136];
  string local_1d0 [136];
  string local_148 [143];
  allocator local_b9;
  string local_b8 [39];
  allocator local_91;
  string local_90 [39];
  allocator local_69;
  string local_68 [55];
  allocator local_31;
  string local_30 [44];
  int local_4;
  
  uVar6 = (undefined1)((ulong)in_stack_fffffffffffff500 >> 0x38);
  uVar7 = (undefined1)((ulong)in_stack_fffffffffffff548 >> 0x38);
  local_4 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_30,
             "((((a:0.0589988989102,(b:0.0418326893396,c:0.859140507521):2.61261891006):0.990549866809,(d:4.14397236141,f:0.17088326593):0.0323075746352):2.02262974527,g:0.693675923359):0.428536225039,(i:1.69919541269,j:0.362508537093):0.195899634738):0.0;"
             ,&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_68,
             "((a:2.03481158672,((b:0.374332029372,c:3.8377563921):0.258935532423,((e:2.18939751337,f:2.17982498905):0.623171789534,g:0.12443873179):0.845298009923):0.0780727161207):0.271887473804,(h:0.125928604756,j:0.64774830898):0.240154552836):0.0;"
             ,&local_69);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_90,
             "((((a:0.0589988989102,(b:0.0418326893396,c:0.859140507521):2.61261891006):0.990549866809,(d:4.14397236141,f:0.17088326593):0.0323075746352):2.02262974527,g:0.693675923359):0.624435859777,i:1.69919541269,j:0.362508537093):0.0;"
             ,&local_91);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_b8,
             "((a:2.03481158672,((b:0.374332029372,c:3.8377563921):0.258935532423,((e:2.18939751337,f:2.17982498905):0.623171789534,g:0.12443873179):0.845298009923):0.0780727161207):0.51204202664,h:0.125928604756,j:0.64774830898):0.0;"
             ,&local_b9);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  std::__cxx11::string::string(local_148,local_30);
  PhyloTree::PhyloTree
            (in_stack_fffffffffffffa20,in_stack_fffffffffffffa18,(bool)in_stack_fffffffffffffa17);
  std::__cxx11::string::~string(local_148);
  std::__cxx11::string::string(local_1d0,local_90);
  PhyloTree::PhyloTree
            (in_stack_fffffffffffffa20,in_stack_fffffffffffffa18,(bool)in_stack_fffffffffffffa17);
  std::__cxx11::string::~string(local_1d0);
  std::__cxx11::string::string(local_258,local_68);
  PhyloTree::PhyloTree
            (in_stack_fffffffffffffa20,in_stack_fffffffffffffa18,(bool)in_stack_fffffffffffffa17);
  std::__cxx11::string::~string(local_258);
  std::__cxx11::string::string(local_2e0,local_b8);
  PhyloTree::PhyloTree
            (in_stack_fffffffffffffa20,in_stack_fffffffffffffa18,(bool)in_stack_fffffffffffffa17);
  std::__cxx11::string::~string(local_2e0);
  PhyloTree::leaf_difference(in_stack_fffffffffffff688,in_stack_fffffffffffff680);
  PhyloTree::PhyloTree
            (in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0);
  PhyloTree::PhyloTree
            (in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0);
  PhyloTree::leaf_difference(in_stack_fffffffffffff688,in_stack_fffffffffffff680);
  PhyloTree::PhyloTree
            (in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0);
  PhyloTree::PhyloTree
            (in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0);
  poVar1 = std::operator<<((ostream *)&std::cout,"T1 rooted: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  PhyloTree::toString_abi_cxx11_(in_stack_fffffffffffff738);
  poVar1 = std::operator<<(poVar1,local_500);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_500);
  poVar1 = std::operator<<((ostream *)&std::cout,"T1 unrooted: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  PhyloTree::toString_abi_cxx11_(in_stack_fffffffffffff738);
  poVar1 = std::operator<<(poVar1,local_520);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_520);
  poVar1 = std::operator<<((ostream *)&std::cout,"T2 rooted: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  PhyloTree::toString_abi_cxx11_(in_stack_fffffffffffff738);
  poVar1 = std::operator<<(poVar1,local_540);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_540);
  poVar1 = std::operator<<((ostream *)&std::cout,"T2 unrooted: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  PhyloTree::toString_abi_cxx11_(in_stack_fffffffffffff738);
  poVar1 = std::operator<<(poVar1,local_560);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_560);
  poVar1 = std::operator<<((ostream *)&std::cout,"T1 rooted,pruned: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  PhyloTree::toString_abi_cxx11_(in_stack_fffffffffffff738);
  poVar1 = std::operator<<(poVar1,local_580);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_580);
  poVar1 = std::operator<<((ostream *)&std::cout,"T1 unrooted,pruned: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  PhyloTree::toString_abi_cxx11_(in_stack_fffffffffffff738);
  poVar1 = std::operator<<(poVar1,local_5a0);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_5a0);
  poVar1 = std::operator<<((ostream *)&std::cout,"T2 rooted,pruned: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  PhyloTree::toString_abi_cxx11_(in_stack_fffffffffffff738);
  poVar1 = std::operator<<(poVar1,local_5c0);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_5c0);
  poVar1 = std::operator<<((ostream *)&std::cout,"T2 unrooted,pruned: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  PhyloTree::toString_abi_cxx11_(in_stack_fffffffffffff738);
  poVar1 = std::operator<<(poVar1,(string *)&stack0xfffffffffffffa20);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffa20);
  std::__cxx11::string::string(local_668,local_30);
  PhyloTree::PhyloTree
            (in_stack_fffffffffffffa20,in_stack_fffffffffffffa18,(bool)in_stack_fffffffffffffa17);
  std::__cxx11::string::~string(local_668);
  std::__cxx11::string::string(local_6f0,local_90);
  PhyloTree::PhyloTree
            (in_stack_fffffffffffffa20,in_stack_fffffffffffffa18,(bool)in_stack_fffffffffffffa17);
  std::__cxx11::string::~string(local_6f0);
  poVar1 = std::operator<<((ostream *)&std::cout,"T1 rooted as unrooted: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  PhyloTree::toString_abi_cxx11_(in_stack_fffffffffffff738);
  poVar1 = std::operator<<(poVar1,local_710);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_710);
  poVar1 = std::operator<<((ostream *)&std::cout,"T1 unrooted as rooted: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  PhyloTree::toString_abi_cxx11_(in_stack_fffffffffffff738);
  poVar1 = std::operator<<(poVar1,local_730);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_730);
  poVar1 = std::operator<<((ostream *)&std::cout,"T1 rooted: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  PhyloTree::toString_abi_cxx11_(in_stack_fffffffffffff738);
  poVar1 = std::operator<<(poVar1,local_750);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_750);
  poVar1 = std::operator<<((ostream *)&std::cout,"T1 unrooted: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  PhyloTree::toString_abi_cxx11_(in_stack_fffffffffffff738);
  poVar1 = std::operator<<(poVar1,local_770);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_770);
  poVar1 = std::operator<<((ostream *)&std::cout,"Distance: ");
  dVar4 = Distance::getGeodesicDistance
                    (in_stack_fffffffffffff558,in_stack_fffffffffffff550,(bool)uVar7);
  pvVar2 = (void *)std::ostream::operator<<(poVar1,dVar4);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"Distance: ");
  dVar4 = Distance::getGeodesicDistance
                    (in_stack_fffffffffffff558,in_stack_fffffffffffff550,(bool)uVar7);
  pvVar2 = (void *)std::ostream::operator<<(poVar1,dVar4);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"Distance: ");
  dVar4 = Distance::getGeodesicDistance
                    (in_stack_fffffffffffff558,in_stack_fffffffffffff550,(bool)uVar7);
  pvVar2 = (void *)std::ostream::operator<<(poVar1,dVar4);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"Distance: ");
  pPVar5 = (PhyloTree *)
           Distance::getGeodesicDistance
                     (in_stack_fffffffffffff558,in_stack_fffffffffffff550,(bool)uVar7);
  pPVar3 = (PhyloTree *)std::ostream::operator<<(poVar1,(double)pPVar5);
  std::ostream::operator<<(pPVar3,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"rooted, pruned distance: ");
  dVar4 = Distance::getGeodesicDistance(pPVar5,pPVar3,SUB81((ulong)poVar1 >> 0x38,0));
  pvVar2 = (void *)std::ostream::operator<<(poVar1,dVar4);
  uVar7 = (undefined1)((ulong)poVar1 >> 0x38);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"unrooted, pruned distance: ");
  dVar4 = Distance::getGeodesicDistance(pPVar5,pPVar3,(bool)uVar7);
  pvVar2 = (void *)std::ostream::operator<<(poVar1,dVar4);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"rooted, pruned distance: ");
  t1_00 = (PhyloTree *)
          Distance::getRobinsonFouldsDistance
                    (in_stack_fffffffffffff510,in_stack_fffffffffffff508,(bool)uVar6);
  pPVar3 = (PhyloTree *)std::ostream::operator<<(poVar1,(double)t1_00);
  std::ostream::operator<<(pPVar3,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"unrooted, pruned distance: ");
  dVar4 = Distance::getRobinsonFouldsDistance(t1_00,pPVar3,SUB81((ulong)poVar1 >> 0x38,0));
  pvVar2 = (void *)std::ostream::operator<<(poVar1,dVar4);
  uVar6 = (undefined1)((ulong)poVar1 >> 0x38);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_790,"((a:3,b:4):.1,(c:5,((d:6,e:7):.2,f:8):.3):.4);",&local_791);
  std::allocator<char>::~allocator((allocator<char> *)&local_791);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_7b8,"((a:3,c:4):.5,(d:5,((b:6,e:7):.2,f:8):.3):.4);",&local_7b9);
  std::allocator<char>::~allocator((allocator<char> *)&local_7b9);
  std::__cxx11::string::string(local_848,local_790);
  PhyloTree::PhyloTree
            (in_stack_fffffffffffffa20,in_stack_fffffffffffffa18,(bool)in_stack_fffffffffffffa17);
  std::__cxx11::string::~string(local_848);
  std::__cxx11::string::string(local_8d0,local_7b8);
  PhyloTree::PhyloTree
            (in_stack_fffffffffffffa20,in_stack_fffffffffffffa18,(bool)in_stack_fffffffffffffa17);
  std::__cxx11::string::~string(local_8d0);
  poVar1 = std::operator<<((ostream *)&std::cout,"t1: ");
  PhyloTree::toString_abi_cxx11_(in_stack_fffffffffffff738);
  poVar1 = std::operator<<(poVar1,local_8f0);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_8f0);
  poVar1 = std::operator<<((ostream *)&std::cout,"t2: ");
  PhyloTree::toString_abi_cxx11_(in_stack_fffffffffffff738);
  pPVar5 = (PhyloTree *)std::operator<<(poVar1,local_910);
  std::ostream::operator<<(pPVar5,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_910);
  dVar4 = Distance::getRobinsonFouldsDistance(t1_00,pPVar3,(bool)uVar6);
  std::ostream::operator<<(&std::cout,dVar4);
  local_4 = 0;
  PhyloTree::~PhyloTree(pPVar5);
  PhyloTree::~PhyloTree(pPVar5);
  std::__cxx11::string::~string(local_7b8);
  std::__cxx11::string::~string(local_790);
  PhyloTree::~PhyloTree(pPVar5);
  PhyloTree::~PhyloTree(pPVar5);
  PhyloTree::~PhyloTree(pPVar5);
  PhyloTree::~PhyloTree(pPVar5);
  std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>::~pair
            ((pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>
              *)pPVar5);
  PhyloTree::~PhyloTree(pPVar5);
  PhyloTree::~PhyloTree(pPVar5);
  std::pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>::~pair
            ((pair<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>
              *)pPVar5);
  PhyloTree::~PhyloTree(pPVar5);
  PhyloTree::~PhyloTree(pPVar5);
  PhyloTree::~PhyloTree(pPVar5);
  PhyloTree::~PhyloTree(pPVar5);
  std::__cxx11::string::~string(local_b8);
  std::__cxx11::string::~string(local_90);
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string(local_30);
  return local_4;
}

Assistant:

int main(int argc, char const *argv[]) {
//    string bignewick1("((a:1,b:2):3,(c:4,d:5):6,(e:7,f:8):9);");
//    string bignewick2("((a:1,(b:2,c:3):4):5,(d:6,e:7):8,f:9);");
//    string smallnewick1("((a:1,b:2):3,c:10,f:17);");
//    string smallnewick2("(a:1,(b:2,c:3):4,f:14);");
    string t1_rooted_newick("((((a:0.0589988989102,(b:0.0418326893396,c:0.859140507521):2.61261891006):0.990549866809,(d:4.14397236141,f:0.17088326593):0.0323075746352):2.02262974527,g:0.693675923359):0.428536225039,(i:1.69919541269,j:0.362508537093):0.195899634738):0.0;");
    string t2_rooted_newick("((a:2.03481158672,((b:0.374332029372,c:3.8377563921):0.258935532423,((e:2.18939751337,f:2.17982498905):0.623171789534,g:0.12443873179):0.845298009923):0.0780727161207):0.271887473804,(h:0.125928604756,j:0.64774830898):0.240154552836):0.0;");
    string t1_unrooted_newick("((((a:0.0589988989102,(b:0.0418326893396,c:0.859140507521):2.61261891006):0.990549866809,(d:4.14397236141,f:0.17088326593):0.0323075746352):2.02262974527,g:0.693675923359):0.624435859777,i:1.69919541269,j:0.362508537093):0.0;");
    string t2_unrooted_newick("((a:2.03481158672,((b:0.374332029372,c:3.8377563921):0.258935532423,((e:2.18939751337,f:2.17982498905):0.623171789534,g:0.12443873179):0.845298009923):0.0780727161207):0.51204202664,h:0.125928604756,j:0.64774830898):0.0;");
//    PhyloTree bigtree1(bignewick1, false);
//    PhyloTree bigtree2(bignewick2, false);
//    PhyloTree smalltree1(smallnewick1, false);
//    PhyloTree smalltree2(smallnewick2, false);
//    PhyloTree prunedtree1(bigtree1, std::vector<int>{3,4});
//    PhyloTree prunedtree2(bigtree2, std::vector<int>{3,4});
    PhyloTree t1_rooted(t1_rooted_newick, true);
    PhyloTree t1_unrooted(t1_unrooted_newick, false);
    PhyloTree t2_rooted(t2_rooted_newick, true);
    PhyloTree t2_unrooted(t2_unrooted_newick, false);
    auto p_rooted = t1_rooted.leaf_difference(t2_rooted);
    PhyloTree t1_rooted_pruned(t1_rooted, p_rooted.first);
    PhyloTree t2_rooted_pruned(t2_rooted, p_rooted.first);
    auto p_unrooted = t1_unrooted.leaf_difference(t2_unrooted);
    PhyloTree t1_unrooted_pruned(t1_unrooted, p_unrooted.first);
    PhyloTree t2_unrooted_pruned(t2_unrooted, p_unrooted.first);
    cout << "T1 rooted: " << endl << t1_rooted.toString() << endl;
    cout << "T1 unrooted: " << endl << t1_unrooted.toString() << endl;
    cout << "T2 rooted: " << endl << t2_rooted.toString() << endl;
    cout << "T2 unrooted: " << endl << t2_unrooted.toString() << endl;
    cout << "T1 rooted,pruned: " << endl << t1_rooted_pruned.toString() << endl;
    cout << "T1 unrooted,pruned: " << endl << t1_unrooted_pruned.toString() << endl;
    cout << "T2 rooted,pruned: " << endl << t2_rooted_pruned.toString() << endl;
    cout << "T2 unrooted,pruned: " << endl << t2_unrooted_pruned.toString() << endl;

    PhyloTree t1_r_as_u(t1_rooted_newick, false);
    PhyloTree t1_u_as_r(t1_unrooted_newick, true);

    cout << "T1 rooted as unrooted: " << endl << t1_r_as_u.toString() << endl;
    cout << "T1 unrooted as rooted: " << endl << t1_u_as_r.toString() << endl;
    cout << "T1 rooted: " << endl << t1_rooted.toString() << endl;
    cout << "T1 unrooted: " << endl << t1_unrooted.toString() << endl;
    cout << "Distance: " << Distance::getGeodesicDistance(t1_r_as_u, t1_rooted, false) << endl;
    cout << "Distance: " << Distance::getGeodesicDistance(t1_r_as_u, t1_unrooted, false) << endl;
    cout << "Distance: " << Distance::getGeodesicDistance(t1_u_as_r, t1_rooted, false) << endl;
    cout << "Distance: " << Distance::getGeodesicDistance(t1_u_as_r, t1_unrooted, false) << endl;
//
//    cout << Distance::getGeodesicDistance(smalltree1, smalltree2, false) << endl;
//    cout << Distance::getGeodesicDistance(prunedtree1, prunedtree2, false) << endl;
//    cout << Distance::getGeodesicDistance(smalltree1, prunedtree2, false) << endl;
//    cout << Distance::getGeodesicDistance(prunedtree1, smalltree2, false) << endl;
//    cout << Distance::getGeodesicDistance(smalltree1, smalltree1, false) << endl;
//    cout << Distance::getGeodesicDistance(prunedtree1, prunedtree1, false) << endl;
//    cout << Distance::getGeodesicDistance(smalltree1, prunedtree1, false) << endl;
//    cout << Distance::getGeodesicDistance(prunedtree1, smalltree1, false) << endl;
//    cout << Distance::getGeodesicDistance(smalltree2, smalltree2, false) << endl;
//    cout << Distance::getGeodesicDistance(prunedtree2, prunedtree2, false) << endl;
//    cout << Distance::getGeodesicDistance(smalltree2, prunedtree2, false) << endl;
//    cout << Distance::getGeodesicDistance(prunedtree2, smalltree2, false) << endl;

//    cout << "TESTING" << endl;
//    try {
//        auto rooted_dist = Distance::getGeodesicDistance(t1_rooted, t2_rooted, false);
//        cout << "rooted distance: " << rooted_dist << endl;
//    } catch (std::invalid_argument e) {
//        cout << e.what() << endl;
//    }
//
//    try {
//        cout << "unrooted distance: " << Distance::getGeodesicDistance(t1_unrooted, t2_unrooted, false) << endl;
//    } catch (std::invalid_argument e) {
//        cout << e.what() << endl;
//    }
//
    cout << "rooted, pruned distance: " << Distance::getGeodesicDistance(t1_rooted_pruned, t2_rooted_pruned, false) << endl;
    cout << "unrooted, pruned distance: " << Distance::getGeodesicDistance(t1_unrooted_pruned, t2_unrooted_pruned, false) << endl;
    cout << "rooted, pruned distance: " << Distance::getRobinsonFouldsDistance(t1_rooted_pruned, t2_rooted_pruned, false) << endl;
    cout << "unrooted, pruned distance: " << Distance::getRobinsonFouldsDistance(t1_unrooted_pruned, t2_unrooted_pruned, false) << endl;


    string n1("((a:3,b:4):.1,(c:5,((d:6,e:7):.2,f:8):.3):.4);");
    string n2("((a:3,c:4):.5,(d:5,((b:6,e:7):.2,f:8):.3):.4);");
    PhyloTree t1(n1, true);
    PhyloTree t2(n2, true);
    cout << "t1: " << t1.toString() << endl;
    cout << "t2: " << t2.toString() << endl;
    cout << Distance::getRobinsonFouldsDistance(t1,t2,false);
//    auto res = bigtree1.leaf_difference(smalltree2);
//    Tools::vector_print(res.first.begin(), res.first.end());
//    Tools::vector_print(res.second.begin(), res.second.end());
//    PhyloTreeEdge e(s1);
//    std::cout << e.toString() << std::endl;
//    PhyloTree t(tree, false);
//    for (auto &edge : t.getEdges()) {
//        std::cout << edge.toString() << std::endl;
//        std::cout << edge.getLength() << std::endl;
//        std::cout << "ID: " << edge.getOriginalID() <<std::endl;
//    }
//
//    for (auto len : t.getLeafEdgeLengths()) {
//        std::cout << len << std::endl;
//    }
//
//    PhyloTree bt(bigtree, false);
//    for (auto &edge : bt.getEdges()) {
//        std::cout << edge.toString() << std::endl;
//        std::cout << edge.getLength() << std::endl;
//        std::cout << "ID: " << edge.getOriginalID() <<std::endl;
//    }
//
//    for (auto len : bt.getLeafEdgeLengths()) {
//        std::cout << len << std::endl;
//    }
//
//    vector<PhyloTreeEdge> ptev;
//    int counter = 0;
//    for (size_t i=0; i < sv.size(); ++i) {
//        PhyloTreeEdge pte(sv[i]);
//        pte.setAttribute(lengths[i]);
//        pte.setOriginalID(counter++);
//        ptev.push_back(pte);
//    }
//    vector<string> leafnames{"a", "b", "c", "f"};
//    PhyloTree pt(ptev, leafnames, lengths);
//
//    for (auto &edge : pt.getEdges()) {
//        std::cout << edge.toString() << std::endl;
//        std::cout << edge.getLength() << std::endl;
//        std::cout << "ID: " << edge.getOriginalID() <<std::endl;
//    }
//
//    std::cout << "Leaf Edge Lengths" << std::endl;
//    for (auto len : pt.getLeafEdgeLengths()) {
//        std::cout << len << std::endl;
//    }

    return 0;
}